

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O0

_Bool glsl_build_shader(ALLEGRO_SHADER *shader)

{
  _Bool _Var1;
  GLuint GVar2;
  ALLEGRO_USTR *pAVar3;
  long in_RDI;
  GLchar error_buf [4096];
  ALLEGRO_SHADER_GLSL_S *gl_shader;
  GLint status;
  undefined4 in_stack_ffffffffffffefd8;
  int in_stack_ffffffffffffefdc;
  ALLEGRO_USTR *in_stack_ffffffffffffefe0;
  GLuint in_stack_ffffffffffffefec;
  ALLEGRO_OGL_VARLOCS *in_stack_ffffffffffffeff0;
  char *in_stack_fffffffffffff018;
  int in_stack_fffffffffffff024;
  char *in_stack_fffffffffffff028;
  int in_stack_fffffffffffff034;
  char *in_stack_fffffffffffff038;
  int local_14;
  long local_10;
  _Bool local_1;
  
  if ((*(int *)(in_RDI + 0x50) == 0) && (*(int *)(in_RDI + 0x54) == 0)) {
    local_1 = false;
  }
  else {
    local_10 = in_RDI;
    if (*(int *)(in_RDI + 0x58) != 0) {
      (*_al_glDeleteProgram)(*(GLuint *)(in_RDI + 0x58));
    }
    GVar2 = (*_al_glCreateProgram)();
    *(GLuint *)(in_RDI + 0x58) = GVar2;
    if (*(int *)(in_RDI + 0x58) == 0) {
      local_1 = false;
    }
    else {
      if (*(int *)(in_RDI + 0x50) != 0) {
        (*_al_glAttachShader)(*(GLuint *)(in_RDI + 0x58),*(GLuint *)(in_RDI + 0x50));
      }
      if (*(int *)(in_RDI + 0x54) != 0) {
        (*_al_glAttachShader)(*(GLuint *)(in_RDI + 0x58),*(GLuint *)(in_RDI + 0x54));
      }
      (*_al_glLinkProgram)(*(GLuint *)(in_RDI + 0x58));
      (*_al_glGetProgramiv)(*(GLuint *)(in_RDI + 0x58),0x8b82,&local_14);
      if (local_14 == 0) {
        (*_al_glGetProgramInfoLog)
                  (*(GLuint *)(in_RDI + 0x58),0x1000,(GLsizei *)0x0,&stack0xffffffffffffefd8);
        if (*(long *)(local_10 + 0x10) == 0) {
          pAVar3 = al_ustr_new((char *)0x235b08);
          *(ALLEGRO_USTR **)(local_10 + 0x10) = pAVar3;
        }
        else {
          al_ustr_truncate(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc);
          al_ustr_append_cstr(in_stack_ffffffffffffefe0,
                              (char *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8))
          ;
        }
        _Var1 = _al_trace_prefix(in_stack_fffffffffffff038,in_stack_fffffffffffff034,
                                 in_stack_fffffffffffff028,in_stack_fffffffffffff024,
                                 in_stack_fffffffffffff018);
        if (_Var1) {
          _al_trace_suffix("Link error: %s\n",&stack0xffffffffffffefd8);
        }
        (*_al_glDeleteProgram)(*(GLuint *)(in_RDI + 0x58));
        local_1 = false;
      }
      else {
        lookup_varlocs(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

static bool glsl_build_shader(ALLEGRO_SHADER *shader)
{
   GLint status;
   ALLEGRO_SHADER_GLSL_S *gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;
   GLchar error_buf[4096];

   if (gl_shader->vertex_shader == 0 && gl_shader->pixel_shader == 0)
      return false;

   if (gl_shader->program_object != 0) {
      glDeleteProgram(gl_shader->program_object);
   }

   gl_shader->program_object = glCreateProgram();
   if (gl_shader->program_object == 0)
      return false;

   if (gl_shader->vertex_shader)
      glAttachShader(gl_shader->program_object, gl_shader->vertex_shader);
   if (gl_shader->pixel_shader)
      glAttachShader(gl_shader->program_object, gl_shader->pixel_shader);

   glLinkProgram(gl_shader->program_object);

   glGetProgramiv(gl_shader->program_object, GL_LINK_STATUS, &status);

   if (status == 0) {
      glGetProgramInfoLog(gl_shader->program_object, sizeof(error_buf), NULL,
         error_buf);
      if (shader->log) {
         al_ustr_truncate(shader->log, 0);
         al_ustr_append_cstr(shader->log, error_buf);
      }
      else {
         shader->log = al_ustr_new(error_buf);
      }
      ALLEGRO_ERROR("Link error: %s\n", error_buf);
      glDeleteProgram(gl_shader->program_object);
      return false;
   }

   /* Look up variable locations. */
   lookup_varlocs(&gl_shader->varlocs, gl_shader->program_object);

   return true;
}